

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<(unnamed_enum_at_/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/include/cubeb/cubeb.h:300:1)>
     ::Print(anon_enum_32 *value,ostream *os)

{
  anon_enum_32 *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<__0>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }